

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clientversion.cpp
# Opt level: O3

string * CopyrightHolders(string *__return_storage_ptr__,string *strPrefix)

{
  size_type sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long in_FS_OFFSET;
  string copyright_devs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  size_type *local_98;
  size_type local_90;
  size_type local_88;
  undefined8 uStack_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_98 = &local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"The %s developers","");
  if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"The %s developers","");
  }
  else {
    local_b8._M_dataplus._M_p = "The %s developers";
    (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
              (&local_78,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_b8);
  }
  tinyformat::format<char[13]>(&local_58,&local_78,(char (*) [13])"Bitcoin Core");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  std::operator+(__return_storage_ptr__,strPrefix,&local_58);
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (&local_58,"Bitcoin Core",0,0xc);
  if (sVar1 == 0xffffffffffffffff) {
    std::operator+(&local_b8,"\n",strPrefix);
    pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_b8,"The Bitcoin Core developers");
    local_98 = (size_type *)(pbVar2->_M_dataplus)._M_p;
    paVar3 = &pbVar2->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98 == paVar3) {
      local_88 = paVar3->_M_allocated_capacity;
      uStack_80 = *(undefined8 *)((long)&pbVar2->field_2 + 8);
      local_98 = &local_88;
    }
    else {
      local_88 = paVar3->_M_allocated_capacity;
    }
    local_90 = pbVar2->_M_string_length;
    (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
    pbVar2->_M_string_length = 0;
    (pbVar2->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (__return_storage_ptr__,(char *)local_98,local_90);
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string CopyrightHolders(const std::string& strPrefix)
{
    const auto copyright_devs = strprintf(_(COPYRIGHT_HOLDERS).translated, COPYRIGHT_HOLDERS_SUBSTITUTION);
    std::string strCopyrightHolders = strPrefix + copyright_devs;

    // Make sure Bitcoin Core copyright is not removed by accident
    if (copyright_devs.find("Bitcoin Core") == std::string::npos) {
        strCopyrightHolders += "\n" + strPrefix + "The Bitcoin Core developers";
    }
    return strCopyrightHolders;
}